

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::PrintCharsAsStringTo<wchar_t>(wchar_t *begin,size_t len,ostream *os)

{
  bool bVar1;
  CharFormat CVar2;
  ostream *poVar3;
  ostream *in_RDX;
  ulong in_RSI;
  long in_RDI;
  wchar_t cur;
  size_t index;
  bool is_previous_hex;
  char *kQuoteBegin;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  ulong uVar5;
  
  std::operator<<(in_RDX,"L\"");
  bVar1 = false;
  for (uVar5 = 0; uVar5 < in_RSI; uVar5 = uVar5 + 1) {
    uVar4 = *(undefined4 *)(in_RDI + uVar5 * 4);
    if ((bVar1) && (bVar1 = IsXDigit(L'\0'), bVar1)) {
      poVar3 = std::operator<<(in_RDX,"\" ");
      std::operator<<(poVar3,"L\"");
    }
    CVar2 = PrintAsStringLiteralTo
                      ((wchar_t)uVar5,(ostream *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
    bVar1 = CVar2 == kHexEscape;
  }
  std::operator<<(in_RDX,"\"");
  return;
}

Assistant:

static void PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}